

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
Vertex::Vertex(Vertex *this,StateExample s,int64_t id)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  double dVar1;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  std::__cxx11::
  list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>
  ::list((list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>
          *)0x10caec);
  std::__cxx11::
  list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator>_>
  ::list((list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator>_>
          *)0x10caff);
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[10] = dVar1;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[0xb] = dVar1;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[0xc] = dVar1;
  vertex_iterator::vertex_iterator((vertex_iterator *)0x10cb42);
  return;
}

Assistant:

Vertex(State s, int64_t id) : state(s), vertex_id(id) {}